

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall thread_pool::join_all(thread_pool *this)

{
  bool bVar1;
  reference this_00;
  exception *ex;
  thread *j;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  thread_pool *this_local;
  
  std::atomic<bool>::operator=(&this->m_running,false);
  std::condition_variable::notify_all();
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->m_threads);
  j = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->m_threads);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&j), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
              ::operator*(&__end1);
    bVar1 = std::thread::joinable(this_00);
    if (bVar1) {
      std::thread::join();
    }
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void join_all() {
    m_running = false;
    m_cv.notify_all();

    for (auto& j : m_threads) {
      try {
        if (j.joinable())
          j.join();
      }
      catch (const std::exception& ex) {
        assert(false);
      }
      catch (...) {
        assert(false);
      }
    }
  }